

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QPixmapCache::Key>::reallocateAndGrow
          (QArrayDataPointer<QPixmapCache::Key> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QPixmapCache::Key> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  Key *pKVar3;
  long lVar4;
  long lVar5;
  Key *pKVar6;
  Key *other;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QArrayDataPointer<QPixmapCache::Key> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QPixmapCache::Key> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar7 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,8,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3),
                        Grow);
    this->d = (Data *)auVar7._0_8_;
    this->ptr = (Key *)auVar7._8_8_;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Key *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    pKVar3 = local_48.ptr;
    lVar4 = this->size;
    if (lVar4 == 0) {
      lVar4 = 0;
    }
    else {
      lVar5 = (n >> 0x3f & n) + lVar4;
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QPixmapCache::Key> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if ((lVar5 != 0) && (0 < lVar5)) {
          other = this->ptr;
          pKVar6 = other + lVar5;
          do {
            QPixmapCache::Key::Key(pKVar3 + local_48.size,other);
            other = other + 1;
            local_48.size = local_48.size + 1;
          } while (other < pKVar6);
          lVar4 = this->size;
        }
      }
      else if ((lVar5 != 0) && (0 < lVar5)) {
        pKVar6 = this->ptr;
        pKVar3 = pKVar6 + lVar5;
        do {
          local_48.ptr[local_48.size].d = pKVar6->d;
          pKVar6->d = (KeyData *)0x0;
          pKVar6 = pKVar6 + 1;
          local_48.size = local_48.size + 1;
        } while (pKVar6 < pKVar3);
      }
    }
    pDVar2 = this->d;
    pKVar3 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    this->size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pKVar3;
    local_48.size = lVar4;
    if (old != (QArrayDataPointer<QPixmapCache::Key> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar2;
      old->ptr = pKVar3;
      local_48.size = old->size;
      old->size = lVar4;
    }
    ~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }